

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O0

void visit_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  gnode_n env_00;
  long lVar1;
  long lVar2;
  _Bool _Var3;
  uint32_t uVar4;
  symboltable_t *table;
  int local_9c;
  gnode_t *local_98;
  gnode_var_t *local_90;
  gnode_t *local_88;
  long local_80;
  long local_70;
  int local_5c;
  int *piStack_58;
  uint32_t n2;
  gnode_class_decl_t *super;
  gnode_class_decl_t *c;
  gnode_var_t *p;
  size_t i;
  _Bool env_is_function;
  gnode_n env;
  size_t count;
  symboltable_t *symtable;
  gnode_t *top;
  gnode_variable_decl_t *node_local;
  gvisitor_t *self_local;
  
  if (*self->data == 0) {
    local_70 = 0;
  }
  else {
    local_70 = **self->data;
  }
  if (local_70 - 1U < **self->data) {
    if (*self->data == 0) {
      local_80 = 0;
    }
    else {
      local_80 = **self->data;
    }
    local_88 = *(gnode_t **)(*(long *)(*self->data + 0x10) + (local_80 + -1) * 8);
  }
  else {
    local_88 = (gnode_t *)0x0;
  }
  table = symtable_from_node(local_88);
  if (node->decls == (gnode_r *)0x0) {
    local_90 = (gnode_var_t *)0x0;
  }
  else {
    local_90 = (gnode_var_t *)node->decls->n;
  }
  env_00 = local_88->tag;
  check_access_storage_specifiers(self,&node->base,env_00,node->access,node->storage);
  p = (gnode_var_t *)0x0;
  do {
    if (local_90 <= p) {
      return;
    }
    if (p < (gnode_var_t *)node->decls->n) {
      local_98 = node->decls->p[(long)p];
    }
    else {
      local_98 = (gnode_t *)0x0;
    }
    *(gnode_t **)(local_98 + 1) = local_88;
    lVar1._0_4_ = local_98[1].token.colno;
    lVar1._4_4_ = local_98[1].token.position;
    if (lVar1 != 0) {
      gvisit(self,*(gnode_t **)&local_98[1].token.colno);
    }
    lVar2._0_4_ = local_98[1].token.colno;
    lVar2._4_4_ = local_98[1].token.position;
    if ((lVar2 == 0) || (**(int **)&local_98[1].token.colno != 7)) {
      if (env_00 == NODE_FUNCTION_DECL) {
        _Var3 = symboltable_insert(table,*(char **)&local_98[1].block_length,local_98);
        if (_Var3) {
          uVar4 = symboltable_local_index(table);
          *(short *)&local_98[1].token.length = (short)uVar4;
        }
        else {
          report_error(self,GRAVITY_ERROR_SEMANTIC,local_98,"Identifier %s redeclared.",
                       *(undefined8 *)&local_98[1].block_length);
        }
      }
      else if ((env_00 == NODE_CLASS_DECL) && ((local_98[1].token.length & 0x1000000) == 0)) {
        if (node->storage == TOK_KEY_STATIC) {
          *(int *)&local_88[2].field_0xc = *(int *)&local_88[2].field_0xc + 1;
        }
        else {
          local_88[2].block_length = local_88[2].block_length + 1;
        }
        piStack_58 = *(int **)&local_88[1].token.bytes;
        if (piStack_58 != (int *)0x0) {
          if (piStack_58 == (int *)0x0) {
            return;
          }
          if (*piStack_58 != 10) {
            return;
          }
        }
        local_5c = 0;
        for (; piStack_58 != (int *)0x0; piStack_58 = *(int **)(piStack_58 + 0x1a)) {
          if (node->storage == TOK_KEY_STATIC) {
            local_9c = piStack_58[0x27];
          }
          else {
            local_9c = piStack_58[0x26];
          }
          local_5c = local_9c + local_5c;
        }
        *(short *)&local_98[1].token.length = (short)local_98[1].token.length + (short)local_5c;
      }
    }
    p = (gnode_var_t *)((long)&(p->base).tag + 1);
  } while( true );
}

Assistant:

static void visit_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    gnode_t         *top = TOP_DECLARATION();
    symboltable_t   *symtable = symtable_from_node(top);
    size_t          count = gnode_array_size(node->decls);
    gnode_n         env = NODE_TAG(top);
    bool            env_is_function = (env == NODE_FUNCTION_DECL);

    // check if optional access and storage specifiers make sense in current context
    check_access_storage_specifiers(self, (gnode_t *)node, env, node->access, node->storage);

    // loop to check each individual declaration
    for (size_t i=0; i<count; ++i) {
        gnode_var_t *p = (gnode_var_t *)gnode_array_get(node->decls, i);
        DEBUG_SEMA2("visit_variable_decl %s", p->identifier);

        // set enclosing environment
        p->env = top;

        // visit expression first in order to prevent var a = a
        // variable with a initial value (or with a getter/setter)
        if (p->expr) visit(p->expr);
        if (NODE_ISA(p->expr, NODE_ENUM_DECL)) continue;
        
//        // check for manifest type
//        if (p->annotation_type) {
//            // struct gnode_var_t was modified with
//            // // untagged union, if no type is declared then this union is NULL otherwise
//            // union {
//            //     const char          *annotation_type;   // optional annotation type
//            //     gnode_class_decl_t  *class_type;        // class type (set in semacheck2 if annotation_type is not NULL)
//            // };
//            gnode_t *class_type = lookup_identifier(self, p->annotation_type, NULL);
//            if (!class_type) {REPORT_WARNING(p, "Unable to find type %s.", p->annotation_type);}
//        //     if (!NODE_ISA(class_type, NODE_CLASS_DECL)) {REPORT_ERROR(p, "Unable to set non class type %s.", p->annotation_type); continue;}
//        //     p->class_type = (gnode_class_decl_t *)class_type;
//        }
        
        if (env_is_function) {
            // local variable defined inside a function
            if (!symboltable_insert(symtable, p->identifier, (void *)p)) {
                REPORT_ERROR(p, "Identifier %s redeclared.", p->identifier);
                continue;
            }
            SET_LOCAL_INDEX(p, symtable);
            DEBUG_SEMA2("Local:%s index:%d", p->identifier, p->index);
        } else if (env == NODE_CLASS_DECL) {
            if (p->iscomputed) continue;
            
            // variable defined inside a class => property
            gnode_class_decl_t *c = (gnode_class_decl_t *)top;

            // compute new ivar index
            (node->storage == TOK_KEY_STATIC) ? ++c->nsvar : ++c->nivar;

            // super class is a static information so I can solve the fragile class problem at compilation time
            gnode_class_decl_t *super = (gnode_class_decl_t *)c->superclass;
            if (super && !NODE_ISA(super, NODE_CLASS_DECL)) return;
            
            uint32_t n2 = 0;
            while (super) {
                n2 += (node->storage == TOK_KEY_STATIC) ? super->nsvar : super->nivar;
                super = (gnode_class_decl_t *)super->superclass;
            }

            p->index += n2;
            DEBUG_SEMA2("Class: %s property:%s index:%d (static %d)", c->identifier, p->identifier, p->index, (node->storage == TOK_KEY_STATIC));
        }
    }
}